

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_convolve_x_sr_c(uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
                        InterpFilterParams *filter_params_x,int subpel_x_qn,
                        ConvolveParams *conv_params)

{
  byte bVar1;
  ushort uVar2;
  int16_t *piVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int local_68;
  ulong local_60;
  
  if (0 < h) {
    uVar2 = filter_params_x->taps;
    bVar4 = 7 - (char)conv_params->round_0;
    piVar3 = filter_params_x->filter_ptr;
    local_68 = 1 - (uint)(uVar2 >> 1);
    local_60 = 0;
    do {
      if (0 < w) {
        uVar7 = 0;
        iVar5 = local_68;
        do {
          if ((ulong)filter_params_x->taps == 0) {
            iVar6 = 0;
          }
          else {
            uVar8 = 0;
            iVar6 = 0;
            do {
              iVar6 = iVar6 + (uint)src[uVar8 + (long)iVar5] *
                              (int)*(short *)((long)piVar3 +
                                             uVar8 * 2 +
                                             (ulong)((subpel_x_qn & 0xfU) * (uint)uVar2 * 2));
              uVar8 = uVar8 + 1;
            } while (filter_params_x->taps != uVar8);
          }
          bVar1 = (byte)conv_params->round_0;
          iVar6 = (((1 << (bVar1 & 0x1f)) >> 1) + iVar6 >> (bVar1 & 0x1f)) +
                  ((1 << (bVar4 & 0x1f)) >> 1) >> (bVar4 & 0x1f);
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          dst[uVar7 + local_60 * (long)dst_stride] = (uint8_t)iVar6;
          uVar7 = uVar7 + 1;
          iVar5 = iVar5 + 1;
        } while (uVar7 != (uint)w);
      }
      local_60 = local_60 + 1;
      local_68 = local_68 + src_stride;
    } while (local_60 != (uint)h);
  }
  return;
}

Assistant:

void av1_convolve_x_sr_c(const uint8_t *src, int src_stride, uint8_t *dst,
                         int dst_stride, int w, int h,
                         const InterpFilterParams *filter_params_x,
                         const int subpel_x_qn, ConvolveParams *conv_params) {
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bits = FILTER_BITS - conv_params->round_0;

  assert(bits >= 0);
  assert((FILTER_BITS - conv_params->round_1) >= 0 ||
         ((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS));

  // horizontal filter
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);

  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_x->taps; ++k) {
        res += x_filter[k] * src[y * src_stride + x - fo_horiz + k];
      }
      res = ROUND_POWER_OF_TWO(res, conv_params->round_0);
      dst[y * dst_stride + x] = clip_pixel(ROUND_POWER_OF_TWO(res, bits));
    }
  }
}